

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

bool __thiscall
libcellml::Component::ComponentImpl::equalResets(ComponentImpl *this,ComponentPtr *other)

{
  bool bVar1;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  entities;
  EntityPtr EStack_38;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::shared_ptr<libcellml::Reset>const*,std::back_insert_iterator<std::vector<std::shared_ptr<libcellml::Entity>,std::allocator<std::shared_ptr<libcellml::Entity>>>>>
            ((this->mResets).
             super__Vector_base<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->mResets).
             super__Vector_base<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_28);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)&EStack_38,
             &other->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = equalEntities(&EStack_38,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&EStack_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>::
  ~vector(&local_28);
  return bVar1;
}

Assistant:

bool Component::ComponentImpl::equalResets(const ComponentPtr &other) const
{
    std::vector<EntityPtr> entities;
    std::copy(mResets.begin(), mResets.end(), std::back_inserter(entities));
    return equalEntities(other, entities);
}